

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O2

void __thiscall
OSSLEVPSymmetricAlgorithm::counterBitsInit
          (OSSLEVPSymmetricAlgorithm *this,ByteString *iv,size_t counterBits)

{
  int iVar1;
  BIGNUM *pBVar2;
  undefined4 extraout_var;
  int n;
  
  BN_free((BIGNUM *)this->maximumBytes);
  this->maximumBytes = (BIGNUM *)0x0;
  BN_free((BIGNUM *)this->counterBytes);
  this->counterBytes = (BIGNUM *)0x0;
  if (counterBits != 0) {
    pBVar2 = (BIGNUM *)OSSL::byteString2bn(iv);
    BN_mask_bits(pBVar2,(int)counterBits);
    while (counterBits != 0) {
      counterBits = counterBits - 1;
      n = (int)counterBits;
      iVar1 = BN_is_bit_set(pBVar2,n);
      if (iVar1 == 0) {
        BN_set_bit(pBVar2,n);
      }
      else {
        BN_clear_bit(pBVar2,n);
      }
    }
    BN_add_word(pBVar2,1);
    iVar1 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    BN_mul_word(pBVar2,CONCAT44(extraout_var,iVar1));
    this->maximumBytes = (BIGNUM *)pBVar2;
    pBVar2 = BN_new();
    this->counterBytes = (BIGNUM *)pBVar2;
    BN_zero_ex(pBVar2);
    return;
  }
  return;
}

Assistant:

void OSSLEVPSymmetricAlgorithm::counterBitsInit(const ByteString& iv, size_t counterBits)
{
	BN_free(maximumBytes);
	maximumBytes = NULL;
	BN_free(counterBytes);
	counterBytes = NULL;

	// Check the counter bits
	if (counterBits > 0)
	{
		BIGNUM* counter = OSSL::byteString2bn(iv);
		BN_mask_bits(counter, counterBits);

		// Reverse the bits
		while (counterBits > 0)
		{
			counterBits--;
			if (BN_is_bit_set(counter, counterBits))
			{
				BN_clear_bit(counter, counterBits);
			}
			else
			{
				BN_set_bit(counter, counterBits);
			}
		}

		// Set the maximum bytes
		BN_add_word(counter, 1);
		BN_mul_word(counter, getBlockSize());
		maximumBytes = counter;
		counterBytes = BN_new();
		BN_zero(counterBytes);
	}
}